

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O3

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc2 *func,Interval *arg0,Interval *arg1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  deRoundingMode dVar4;
  byte bVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double local_c8;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar16 = arg0->m_lo;
  local_c8 = arg0->m_hi;
  if (dVar16 <= local_c8) {
    dVar13 = arg1->m_lo;
    dVar17 = arg1->m_hi;
    if (dVar13 <= dVar17) {
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar7 = (*func)(dVar16,dVar13);
      dVar17 = dVar7;
      if (NAN(dVar7)) {
        dVar17 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar9 = (*func)(dVar16,dVar13);
      dVar13 = dVar9;
      if (NAN(dVar9)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(dVar4);
      dVar10 = arg1->m_hi;
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar8 = (*func)(dVar16,dVar10);
      dVar18 = dVar8;
      if (NAN(dVar8)) {
        dVar18 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar11 = (*func)(dVar16,dVar10);
      deSetRoundingMode(dVar4);
      dVar10 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 | -(ulong)NAN(dVar7) & 0xfff0000000000000
                       );
      dVar16 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0xfff0000000000000
                       );
      uVar6 = -(ulong)(dVar16 <= dVar10);
      dVar14 = (double)(-(ulong)(dVar17 <= dVar13) & (ulong)dVar17 |
                       ~-(ulong)(dVar17 <= dVar13) & (ulong)dVar13);
      dVar13 = (double)(uVar6 & (ulong)dVar10 | ~uVar6 & (ulong)dVar16);
      dVar16 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar8 | -(ulong)NAN(dVar8) & 0xfff0000000000000
                       );
      dVar17 = dVar11;
      if (NAN(dVar11)) {
        dVar17 = -INFINITY;
      }
      uVar6 = -(ulong)(dVar17 <= dVar16);
      dVar17 = (double)(uVar6 & (ulong)dVar16 | ~uVar6 & (ulong)dVar17);
      dVar16 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar11 |
                       -(ulong)NAN(dVar11) & 0x7ff0000000000000);
      uVar6 = -(ulong)(dVar18 <= dVar16);
      dVar16 = (double)(uVar6 & (ulong)dVar18 | ~uVar6 & (ulong)dVar16);
      bVar2 = (NAN(dVar7) || NAN(dVar9)) || (NAN(dVar8) || NAN(dVar11));
      uVar6 = -(ulong)(dVar14 <= dVar16);
      dVar7 = (double)(uVar6 & (ulong)dVar14 | ~uVar6 & (ulong)dVar16);
      uVar6 = -(ulong)(dVar17 <= dVar13);
      dVar16 = (double)(uVar6 & (ulong)dVar13 | ~uVar6 & (ulong)dVar17);
      local_c8 = arg0->m_hi;
      dVar13 = arg1->m_lo;
      dVar17 = arg1->m_hi;
    }
    else {
      bVar2 = false;
      dVar7 = INFINITY;
      dVar16 = -INFINITY;
    }
    dVar10 = INFINITY;
    dVar9 = -INFINITY;
    bVar1 = arg1->m_hasNaN;
    if (dVar13 <= dVar17) {
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar9 = (*func)(local_c8,dVar13);
      dVar17 = dVar9;
      if (NAN(dVar9)) {
        dVar17 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar10 = (*func)(local_c8,dVar13);
      dVar13 = dVar10;
      if (NAN(dVar10)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(dVar4);
      dVar18 = arg1->m_hi;
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = (*func)(local_c8,dVar18);
      dVar8 = dVar11;
      if (NAN(dVar11)) {
        dVar8 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar12 = (*func)(local_c8,dVar18);
      deSetRoundingMode(dVar4);
      dVar14 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0xfff0000000000000
                       );
      dVar18 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar10 |
                       -(ulong)NAN(dVar10) & 0xfff0000000000000);
      uVar6 = -(ulong)(dVar18 <= dVar14);
      dVar15 = (double)(-(ulong)(dVar17 <= dVar13) & (ulong)dVar17 |
                       ~-(ulong)(dVar17 <= dVar13) & (ulong)dVar13);
      dVar17 = (double)(uVar6 & (ulong)dVar14 | ~uVar6 & (ulong)dVar18);
      dVar13 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar11 |
                       -(ulong)NAN(dVar11) & 0xfff0000000000000);
      dVar18 = dVar12;
      if (NAN(dVar12)) {
        dVar18 = -INFINITY;
      }
      uVar6 = -(ulong)(dVar18 <= dVar13);
      dVar18 = (double)(uVar6 & (ulong)dVar13 | ~uVar6 & (ulong)dVar18);
      dVar13 = (double)(~-(ulong)NAN(dVar12) & (ulong)dVar12 |
                       -(ulong)NAN(dVar12) & 0x7ff0000000000000);
      uVar6 = -(ulong)(dVar8 <= dVar13);
      dVar13 = (double)(uVar6 & (ulong)dVar8 | ~uVar6 & (ulong)dVar13);
      bVar3 = (bool)((-(NAN(dVar9) || NAN(dVar10)) | -(NAN(dVar11) || NAN(dVar12))) & 1);
      uVar6 = -(ulong)(dVar15 <= dVar13);
      dVar10 = (double)(uVar6 & (ulong)dVar15 | ~uVar6 & (ulong)dVar13);
      uVar6 = -(ulong)(dVar18 <= dVar17);
      dVar9 = (double)(uVar6 & (ulong)dVar17 | ~uVar6 & (ulong)dVar18);
      bVar5 = arg1->m_hasNaN;
    }
    else {
      bVar3 = false;
      bVar5 = bVar1;
    }
    if ((bVar5 & 1) != 0) {
      bVar3 = true;
    }
    if (bVar1 != false) {
      bVar3 = true;
    }
    if (bVar2) {
      bVar3 = true;
    }
    dVar13 = (double)(~-(ulong)(dVar7 <= dVar10) & (ulong)dVar10 |
                     (ulong)dVar7 & -(ulong)(dVar7 <= dVar10));
    dVar16 = (double)(~-(ulong)(dVar9 <= dVar16) & (ulong)dVar9 |
                     (ulong)dVar16 & -(ulong)(dVar9 <= dVar16));
  }
  else {
    dVar13 = INFINITY;
    dVar16 = -INFINITY;
    bVar3 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar3;
  __return_storage_ptr__->m_lo = dVar13;
  __return_storage_ptr__->m_hi = dVar16;
  if (arg0->m_hasNaN == true) {
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar13;
    __return_storage_ptr__->m_hi = dVar16;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc2& func, const Interval& arg0, const Interval& arg1)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, x, arg0, y, arg1, val,
								 TCU_SET_INTERVAL(val, point, point = func(x, y)));

	return ret;
}